

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize-text.c++
# Opt level: O1

void __thiscall capnp::TextCodec::decode(TextCodec *this,StringPtr input,Builder output)

{
  uint uVar1;
  uint uVar2;
  word **ppwVar3;
  Builder result;
  Builder builder;
  Reader assignments;
  BuilderArena *pBVar4;
  word **ppwVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  Orphanage orphanageParam;
  ArrayPtr<const_char> input_00;
  Fault f;
  ThrowingErrorReporter errorReporter;
  ParserInput parserInput;
  NullableValue<capnp::Orphan<capnp::compiler::Expression>_> expression;
  ExternalResolver nullResolver;
  ThrowingErrorReporter errorReporter_1;
  ValueTranslator translator;
  Builder lexedTokens;
  Reader tokens;
  MallocMessageBuilder tokenArena;
  CapnpParser parser;
  undefined1 local_468 [16];
  SegmentBuilder *pSStack_458;
  WirePointer *pWStack_450;
  WirePointer *pWStack_448;
  StructDataBitCount SStack_440;
  StructPointerCount SStack_43c;
  undefined2 uStack_43a;
  ErrorReporter local_430;
  int local_424;
  Builder local_420;
  SegmentBuilder *local_408;
  ElementCount local_400;
  short local_3fc;
  ListReader *local_3f8;
  uint local_3f0;
  char local_3e8;
  OrphanBuilder local_3e0;
  Resolver local_3c0;
  ErrorReporter local_3b8;
  StructReader local_3b0;
  ValueTranslator local_380;
  StructBuilder local_360;
  ListReader local_338;
  ListReader local_308;
  PointerReader local_2d8;
  MallocMessageBuilder local_2b8;
  CapnpParser local_1c8;
  
  local_430._vptr_ErrorReporter = (_func_int **)&PTR_addError_0064ada0;
  MallocMessageBuilder::MallocMessageBuilder(&local_2b8,0x400,GROW_HEURISTICALLY);
  MessageBuilder::getRootInternal(&local_420,&local_2b8.super_MessageBuilder);
  local_1c8.orphanage.arena = (BuilderArena *)local_420.builder.segment;
  local_1c8.orphanage.capTable = local_420.builder.capTable;
  capnp::_::PointerBuilder::initStruct(&local_360,(PointerBuilder *)&local_1c8,(StructSize)0x10000);
  result._builder.capTable = local_360.capTable;
  result._builder.segment = local_360.segment;
  result._builder.data = local_360.data;
  result._builder.pointers = local_360.pointers;
  result._builder.dataSize = local_360.dataSize;
  result._builder.pointerCount = local_360.pointerCount;
  result._builder._38_2_ = local_360._38_2_;
  input_00.size_ = input.content.size_ - 1;
  input_00.ptr = input.content.ptr;
  capnp::compiler::lex(input_00,result,&local_430);
  orphanageParam = MessageBuilder::getOrphanage(&local_2b8.super_MessageBuilder);
  capnp::compiler::CapnpParser::CapnpParser(&local_1c8,orphanageParam,&local_430);
  capnp::_::StructBuilder::asReader(&local_360);
  if (local_3fc == 0) {
    local_3f8._0_4_ = 0x7fffffff;
    local_420.builder.capTable = (CapTableBuilder *)0x0;
    local_408 = (SegmentBuilder *)0x0;
    local_420.builder.segment = (SegmentBuilder *)0x0;
  }
  pWStack_450 = (WirePointer *)CONCAT44(pWStack_450._4_4_,local_3f8._0_4_);
  local_468._0_8_ = local_420.builder.segment;
  local_468._8_8_ = local_420.builder.capTable;
  pSStack_458 = local_408;
  capnp::_::PointerReader::getList
            (&local_338,(PointerReader *)local_468,INLINE_COMPOSITE,(word *)0x0);
  local_420.builder.segment = (SegmentBuilder *)0x0;
  local_420.builder.pointer._0_4_ = 0;
  local_400 = local_338.elementCount;
  local_3f0 = 0;
  local_420.builder.capTable = (CapTableBuilder *)&local_338;
  local_408 = (SegmentBuilder *)&local_338;
  local_3f8 = &local_338;
  if (local_338.elementCount == 0) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[22]>
              ((Fault *)local_468,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/serialize-text.c++"
               ,0x57,FAILED,(char *)0x0,"\"Failed to read input.\"",
               (char (*) [22])"Failed to read input.");
    kj::_::Debug::Fault::fatal((Fault *)local_468);
  }
  (*(code *)**(undefined8 **)local_1c8.parsers.expression.wrapper)
            (local_468,local_1c8.parsers.expression.wrapper,local_1c8.parsers.expression.parser);
  local_3e8 = local_468[0];
  if (local_468[0] == '\x01') {
    local_3e0.capTable = (CapTableBuilder *)pWStack_450;
    local_3e0.location = (word *)pWStack_448;
    local_3e0.tag.content = local_468._8_8_;
    local_3e0.segment = pSStack_458;
    pSStack_458 = (SegmentBuilder *)0x0;
    pWStack_448 = (WirePointer *)0x0;
  }
  if ((local_468[0] != '\0') && (pSStack_458 != (SegmentBuilder *)0x0)) {
    capnp::_::OrphanBuilder::euthanize((OrphanBuilder *)(local_468 + 8));
  }
  if (local_3e8 == '\x01') {
    if ((uint)local_420.builder.pointer != local_338.elementCount) {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[23]>
                ((Fault *)local_468,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/serialize-text.c++"
                 ,0x4b,FAILED,"parserInput.getPosition() == tokens.end()",
                 "\"Extra tokens in input.\"",(char (*) [23])"Extra tokens in input.");
      kj::_::Debug::Fault::fatal((Fault *)local_468);
    }
    capnp::_::OrphanBuilder::asStructReader(&local_3b0,&local_3e0,(StructSize)0x20003);
    if ((local_3b0.dataSize < 0x10) || (*local_3b0.data != 7)) {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[33]>
                ((Fault *)local_468,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/serialize-text.c++"
                 ,0x74,FAILED,"expression.isTuple()","\"Input does not contain a struct.\"",
                 (char (*) [33])"Input does not contain a struct.");
      kj::_::Debug::Fault::fatal((Fault *)local_468);
    }
    local_424 = local_3b0.nestingLimit;
    local_3b8._vptr_ErrorReporter = (_func_int **)&PTR_addError_0064ada0;
    local_3c0._vptr_Resolver = (_func_int **)&PTR_resolveConstant_0064add8;
    pWStack_448 = (WirePointer *)output.builder._32_8_;
    pSStack_458 = (SegmentBuilder *)output.builder.data;
    pWStack_450 = output.builder.pointers;
    local_468._0_8_ = output.builder.segment;
    local_468._8_8_ = output.builder.capTable;
    pBVar4 = capnp::_::StructBuilder::getArena((StructBuilder *)local_468);
    local_380.orphanage.capTable = capnp::_::StructBuilder::getCapTable((StructBuilder *)local_468);
    local_380.resolver = &local_3c0;
    local_380.errorReporter = &local_3b8;
    local_468._0_8_ = output.schema.super_Schema.raw;
    local_468._8_8_ = output.builder.segment;
    pSStack_458 = (SegmentBuilder *)output.builder.capTable;
    pWStack_450 = (WirePointer *)output.builder.data;
    pWStack_448 = output.builder.pointers;
    SStack_440 = output.builder.dataSize;
    SStack_43c = output.builder.pointerCount;
    uStack_43a = output.builder._38_2_;
    local_2d8.nestingLimit = local_424;
    if (local_3b0.pointerCount == 0) {
      local_3b0.capTable = (CapTableReader *)0x0;
      local_3b0.pointers = (WirePointer *)0x0;
      local_3b0.segment = (SegmentReader *)0x0;
      local_2d8.nestingLimit = 0x7fffffff;
    }
    local_380.orphanage.arena = pBVar4;
    local_2d8.segment = local_3b0.segment;
    local_2d8.capTable = local_3b0.capTable;
    local_2d8.pointer = local_3b0.pointers;
    capnp::_::PointerReader::getList(&local_308,&local_2d8,INLINE_COMPOSITE,(word *)0x0);
    builder.builder.segment = (SegmentBuilder *)local_468._8_8_;
    builder.schema.super_Schema.raw = (Schema)(Schema)local_468._0_8_;
    builder.builder.capTable = (CapTableBuilder *)pSStack_458;
    builder.builder.data = pWStack_450;
    builder.builder.pointers = pWStack_448;
    builder.builder.dataSize = SStack_440;
    builder.builder.pointerCount = SStack_43c;
    builder.builder._38_2_ = uStack_43a;
    assignments.reader.capTable = local_308.capTable;
    assignments.reader.segment = local_308.segment;
    assignments.reader.ptr = local_308.ptr;
    assignments.reader.elementCount = local_308.elementCount;
    assignments.reader.step = local_308.step;
    assignments.reader.structDataSize = local_308.structDataSize;
    assignments.reader.structPointerCount = local_308.structPointerCount;
    assignments.reader.elementSize = local_308.elementSize;
    assignments.reader._39_1_ = local_308._39_1_;
    assignments.reader.nestingLimit = local_308.nestingLimit;
    assignments.reader._44_4_ = local_308._44_4_;
    capnp::compiler::ValueTranslator::fillStructValue(&local_380,builder,assignments);
  }
  else {
    uVar6 = local_3f0;
    if (local_3f0 < (uint)local_420.builder.pointer) {
      uVar6 = (uint)local_420.builder.pointer;
    }
    if (uVar6 == local_338.elementCount) {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[24]>
                ((Fault *)local_468,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/serialize-text.c++"
                 ,0x51,FAILED,(char *)0x0,"\"Premature end of input.\"",
                 (char (*) [24])"Premature end of input.");
      kj::_::Debug::Fault::fatal((Fault *)local_468);
    }
    capnp::_::ListReader::getStructElement
              ((StructReader *)local_468,
               *(ListReader **)
                ((long)&local_420 + (ulong)((uint)local_420.builder.pointer <= local_3f0) * 0x20 + 8
                ),uVar6);
    uVar7 = 0;
    uVar8 = 0;
    if (0x3f < (uint)pWStack_448) {
      uVar8 = (ulong)*(uint *)((long)&(pSStack_458->super_SegmentReader).arena + 4);
    }
    if (0x9f < (uint)pWStack_448) {
      uVar7 = (ulong)*(uint *)&(pSStack_458->super_SegmentReader).ptr.ptr;
    }
    (**local_430._vptr_ErrorReporter)(&local_430,uVar8,uVar7,"Parse error",0xc);
  }
  if ((local_3e8 == '\x01') && (local_3e0.segment != (SegmentBuilder *)0x0)) {
    capnp::_::OrphanBuilder::euthanize(&local_3e0);
  }
  if (local_420.builder.segment != (SegmentBuilder *)0x0) {
    uVar6 = local_3f0;
    ppwVar3 = (word **)&local_3f8;
    if (local_3f0 < (uint)local_420.builder.pointer) {
      uVar6 = (uint)local_420.builder.pointer;
      ppwVar3 = (word **)&local_420.builder.capTable;
    }
    uVar1 = *(uint *)&(local_420.builder.segment)->readOnly;
    uVar2 = uVar6;
    if (uVar6 <= uVar1) {
      uVar2 = uVar1;
    }
    ppwVar5 = &(local_420.builder.segment)->pos;
    if (uVar1 < uVar6) {
      ppwVar5 = ppwVar3;
    }
    (local_420.builder.segment)->pos = (word *)*ppwVar5;
    *(uint *)&(local_420.builder.segment)->readOnly = uVar2;
  }
  capnp::compiler::CapnpParser::~CapnpParser(&local_1c8);
  MallocMessageBuilder::~MallocMessageBuilder(&local_2b8);
  return;
}

Assistant:

void TextCodec::decode(kj::StringPtr input, DynamicStruct::Builder output) const {
  lexAndParseExpression(input, [&output](compiler::Expression::Reader expression) {
    KJ_REQUIRE(expression.isTuple(), "Input does not contain a struct.");

    ThrowingErrorReporter errorReporter;
    ExternalResolver nullResolver;

    Orphanage orphanage = Orphanage::getForMessageContaining(output);
    compiler::ValueTranslator translator(nullResolver, errorReporter, orphanage);
    translator.fillStructValue(output, expression.getTuple());
  });
}